

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SqlGenerator.cpp
# Opt level: O2

string * __thiscall
SqlGenerator::getFunctionString_abi_cxx11_
          (string *__return_storage_ptr__,SqlGenerator *this,size_t fid)

{
  bool bVar1;
  Function *this_00;
  Attribute *pAVar2;
  size_t i;
  size_t __position;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *this_01;
  string fvars;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b8;
  size_t local_98;
  string local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  local_98 = fid;
  this_00 = QueryCompiler::getFunction
                      ((this->_qc).super___shared_ptr<QueryCompiler,_(__gnu_cxx::_Lock_policy)2>.
                       _M_ptr,fid);
  std::__cxx11::string::string((string *)&local_b8,"",(allocator *)&local_d8);
  for (__position = 0; __position != 100; __position = __position + 1) {
    bVar1 = std::bitset<100UL>::test(&this_00->_fVars,__position);
    if (bVar1) {
      pAVar2 = TreeDecomposition::getAttribute
                         ((this->_td).
                          super___shared_ptr<TreeDecomposition,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                          __position);
      std::operator+(&local_d8,&pAVar2->_name,",");
      std::__cxx11::string::append((string *)&local_b8);
      std::__cxx11::string::~string((string *)&local_d8);
    }
  }
  if (local_b8._M_string_length != 0) {
    std::__cxx11::string::pop_back();
  }
  switch(this_00->_operation) {
  case count:
    std::__cxx11::to_string(&local_d8,local_98);
    std::operator+(__return_storage_ptr__,"f_",&local_d8);
    break;
  case sum:
  case linear_sum:
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b8._M_dataplus._M_p == &local_b8.field_2) {
      (__return_storage_ptr__->field_2)._M_allocated_capacity =
           CONCAT71(local_b8.field_2._M_allocated_capacity._1_7_,local_b8.field_2._M_local_buf[0]);
      *(undefined8 *)((long)&__return_storage_ptr__->field_2 + 8) = local_b8.field_2._8_8_;
    }
    else {
      (__return_storage_ptr__->_M_dataplus)._M_p = local_b8._M_dataplus._M_p;
      (__return_storage_ptr__->field_2)._M_allocated_capacity =
           CONCAT71(local_b8.field_2._M_allocated_capacity._1_7_,local_b8.field_2._M_local_buf[0]);
    }
    __return_storage_ptr__->_M_string_length = local_b8._M_string_length;
    local_b8._M_string_length = 0;
    local_b8.field_2._M_local_buf[0] = '\0';
    local_b8._M_dataplus._M_p = (pointer)&local_b8.field_2;
    goto LAB_001dcf05;
  case quadratic_sum:
    std::operator+(&local_d8,&local_b8,"*");
    std::operator+(__return_storage_ptr__,&local_d8,&local_b8);
    break;
  default:
    std::__cxx11::to_string(&local_d8,local_98);
    std::operator+(__return_storage_ptr__,"f_",&local_d8);
    break;
  case exponential:
    std::__cxx11::to_string(&local_d8,local_98);
    std::operator+(__return_storage_ptr__,"f_",&local_d8);
    break;
  case prod:
    std::__cxx11::to_string(&local_d8,local_98);
    std::operator+(__return_storage_ptr__,"f_",&local_d8);
    break;
  case indicator_eq:
    std::operator+(&local_70,"CASE WHEN ",&local_b8);
    std::operator+(&local_50,&local_70," = ");
    std::__cxx11::to_string(&local_90,*this_00->_parameter);
    std::operator+(&local_d8,&local_50,&local_90);
    std::operator+(__return_storage_ptr__,&local_d8," THEN 1.0 ELSE 0.0 END");
    goto LAB_001dceda;
  case indicator_neq:
    std::operator+(&local_70,"CASE WHEN ",&local_b8);
    std::operator+(&local_50,&local_70," != ");
    std::__cxx11::to_string(&local_90,*this_00->_parameter);
    std::operator+(&local_d8,&local_50,&local_90);
    std::operator+(__return_storage_ptr__,&local_d8," THEN 1.0 ELSE 0.0 END");
    goto LAB_001dceda;
  case indicator_lt:
    std::operator+(&local_70,"CASE WHEN ",&local_b8);
    std::operator+(&local_50,&local_70," <= ");
    std::__cxx11::to_string(&local_90,*this_00->_parameter);
    std::operator+(&local_d8,&local_50,&local_90);
    std::operator+(__return_storage_ptr__,&local_d8," THEN 1.0 ELSE 0.0 END");
    goto LAB_001dceda;
  case indicator_gt:
    std::operator+(&local_70,"CASE WHEN ",&local_b8);
    std::operator+(&local_50,&local_70," > ");
    std::__cxx11::to_string(&local_90,*this_00->_parameter);
    std::operator+(&local_d8,&local_50,&local_90);
    std::operator+(__return_storage_ptr__,&local_d8," THEN 1.0 ELSE 0.0 END");
LAB_001dceda:
    std::__cxx11::string::~string((string *)&local_d8);
    std::__cxx11::string::~string((string *)&local_90);
    std::__cxx11::string::~string((string *)&local_50);
    this_01 = &local_70;
    goto LAB_001dcf00;
  case lr_cont_parameter:
    std::operator+(&local_d8,"(0.15*",&local_b8);
    std::operator+(__return_storage_ptr__,&local_d8,")");
    break;
  case lr_cat_parameter:
    std::__cxx11::string::string((string *)__return_storage_ptr__,"(0.15)",(allocator *)&local_d8);
    goto LAB_001dcf05;
  case dynamic:
    std::__cxx11::string::string((string *)__return_storage_ptr__,"1",(allocator *)&local_d8);
    goto LAB_001dcf05;
  }
  this_01 = &local_d8;
LAB_001dcf00:
  std::__cxx11::string::~string((string *)this_01);
LAB_001dcf05:
  std::__cxx11::string::~string((string *)&local_b8);
  return __return_storage_ptr__;
}

Assistant:

inline string SqlGenerator::getFunctionString(size_t fid)
{
    Function* f = _qc->getFunction(fid);

    string fvars = "";
    for (size_t i = 0; i < NUM_OF_VARIABLES; ++i)
    {
        if (f->_fVars.test(i))
            fvars +=  _td->getAttribute(i)->_name + ",";
    }
    if (!fvars.empty())
        fvars.pop_back();

    switch (f->_operation)
    {
    case Operation::count :
        return "f_"+to_string(fid);
    case Operation::sum :
        return fvars;  
    case Operation::linear_sum :
        return fvars;
    case Operation::quadratic_sum :
        return fvars+"*"+fvars;
    case Operation::prod :
        return "f_"+to_string(fid);
    case Operation::indicator_eq :
        return "CASE WHEN "+fvars+" = "+to_string(f->_parameter[0])+" THEN 1.0 ELSE 0.0 END";
    case Operation::indicator_neq :
        return "CASE WHEN "+fvars+" != "+to_string(f->_parameter[0])+" THEN 1.0 ELSE 0.0 END";
    case Operation::indicator_lt :
        return "CASE WHEN "+fvars+" <= "+to_string(f->_parameter[0])+" THEN 1.0 ELSE 0.0 END";
    case Operation::indicator_gt :
        return "CASE WHEN "+fvars+" > "+to_string(f->_parameter[0])+" THEN 1.0 ELSE 0.0 END";
    case Operation::exponential :
        return "f_"+to_string(fid);
    // case Operation::lr_cont_parameter :
    //     return "("+fvars+"_param*"+fvars+")";
    // case Operation::lr_cat_parameter :
    //     return "("+fvars+"_param)";
    case Operation::lr_cont_parameter :
        return "(0.15*"+fvars+")";
    case Operation::lr_cat_parameter :
        return "(0.15)";
    case Operation::dynamic :
      return "1";
    default : return "f_"+to_string(fid);
    }

    return " ";
}